

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

pair<unsigned_int,_unsigned_int>
kratos::compute_var_high_low
          (Var *root,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *index)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer ppVar4;
  pointer ppVar5;
  pair<unsigned_int,_unsigned_int> pVar6;
  ulong uVar7;
  pointer puVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> bases;
  allocator_type local_31;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
             (long)(root->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(root->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2,&local_31);
  puVar3 = (root->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = (long)(root->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
  uVar15 = (uint)uVar11;
  if (0 < (int)uVar15) {
    uVar7 = (ulong)(uVar15 & 0x7fffffff) + 1;
    iVar10 = 1;
    do {
      *(uint32_t *)((long)local_58 + (uVar7 - 2) * 4) = root->var_width_ * iVar10;
      iVar10 = iVar10 * puVar3[uVar7 - 2];
      uVar7 = uVar7 - 1;
    } while (1 < uVar7);
  }
  ppVar4 = (index->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (index->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)ppVar5 - (long)ppVar4 >> 3;
  puVar8 = (pointer)((long)ppVar5 - (long)ppVar4);
  if (puVar8 == (pointer)0x0) {
    uVar15 = 0;
    uVar16 = 0;
    uVar12 = 0;
LAB_001e9de6:
    if (uVar12 < uVar7) {
      do {
        uVar16 = uVar15;
        uVar15 = ppVar4[uVar12].second + uVar16;
        uVar12 = uVar12 + 1;
      } while (uVar7 != uVar12);
      uVar16 = uVar16 + *(int *)((long)(ppVar4 + -1) + (long)puVar8);
    }
  }
  else {
    uVar13 = 0;
    uVar12 = 0;
    uVar16 = 0;
    uVar15 = 0;
    do {
      uVar1 = ppVar4[uVar12].first;
      uVar2 = ppVar4[uVar12].second;
      iVar10 = uVar1 - uVar2;
      bases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar8;
      if (uVar1 < uVar2 || iVar10 == 0) {
        if (((iVar10 != 0) || (uVar9 = (ulong)uVar13, uVar11 <= uVar9)) || (puVar3[uVar9] < 2))
        goto LAB_001e9de6;
        uVar15 = uVar15 + uVar1 * *(pointer)((long)local_58 + uVar9 * 4);
        iVar10 = *(pointer)((long)local_58 + uVar9 * 4) + uVar15;
        uVar13 = uVar13 + 1;
      }
      else {
        iVar14 = root->var_width_ * *(pointer)((long)local_58 + (ulong)uVar13 * 4);
        uVar15 = uVar15 + uVar2 * iVar14;
        iVar10 = (iVar10 + 1) * iVar14 + uVar15;
      }
      uVar16 = iVar10 - 1;
      uVar12 = uVar12 + 1;
    } while (uVar7 + (uVar7 == 0) != uVar12);
  }
  if (local_58 != (undefined1  [8])0x0) {
    operator_delete((void *)local_58,
                    (long)bases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_58);
  }
  pVar6.second = uVar15;
  pVar6.first = uVar16;
  return pVar6;
}

Assistant:

std::pair<uint32_t, uint32_t> compute_var_high_low(
    const Var *root, const std::vector<std::pair<uint32_t, uint32_t>> &index) {
    // outer to inner
    // flatten the index
    auto const &var_sizes = root->size();
    std::vector<uint32_t> bases(var_sizes.size());
    uint32_t base = 1;
    for (int i = static_cast<int>(var_sizes.size()) - 1; i >= 0; i--) {
        bases[i] = base * root->var_width();
        base *= var_sizes[i];
    }

    uint32_t var_low = 0;
    uint32_t var_high = 0;
    uint32_t index_to_size = 0;
    uint64_t i = 0;
    while (i < index.size()) {
        auto const &[slice_high, slice_low] = index[i];
        if (slice_high > slice_low) {
            var_low += slice_low * bases[index_to_size] * root->var_width();
            var_high = var_low +
                       (slice_high - slice_low + 1) * bases[index_to_size] * root->var_width() - 1;
        } else if (slice_high == slice_low && index_to_size < var_sizes.size() &&
                   var_sizes[index_to_size] > 1) {
            var_low += slice_low * bases[index_to_size];
            var_high = var_low + (slice_high - slice_low + 1) * bases[index_to_size] - 1;
            index_to_size++;
        } else {
            break;
        }
        i++;
    }

    if (i < index.size()) {
        for (; i < index.size(); i++) {
            auto const &[slice_high, slice_low] = index[i];
            var_low += slice_low;
            var_high = var_low + (slice_high - slice_low);
        }
    }

    return {var_high, var_low};
}